

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSA.cpp
# Opt level: O3

void __thiscall OSSLRSA::encrypt(OSSLRSA *this,char *__block,int __edflag)

{
  char cVar1;
  int iVar2;
  RSA *rsa;
  size_t sVar3;
  uchar *from;
  uchar *to;
  ulong uVar4;
  ByteString *in_RCX;
  undefined4 in_register_00000014;
  ByteString *this_00;
  int padding;
  uint in_R8D;
  char *format;
  
  this_00 = (ByteString *)CONCAT44(in_register_00000014,__edflag);
  cVar1 = (**(code **)(*(long *)__block + 0x18))(__block,OSSLRSAPublicKey::type);
  if (cVar1 == '\0') {
    format = "Invalid key type supplied";
    iVar2 = 0x4be;
  }
  else {
    rsa = (RSA *)OSSLRSAPublicKey::getOSSLKey((OSSLRSAPublicKey *)__block);
    if (in_R8D == 1) {
      sVar3 = ByteString::size(this_00);
      iVar2 = RSA_size(rsa);
      padding = 3;
      if (sVar3 == (long)iVar2) goto LAB_0015dfdf;
      format = "Incorrect amount of input data supplied for raw RSA encryption";
      iVar2 = 0x4e8;
    }
    else if (in_R8D == 4) {
      sVar3 = ByteString::size(this_00);
      iVar2 = RSA_size(rsa);
      padding = 4;
      if (sVar3 <= (ulong)(long)(iVar2 + -0x29)) goto LAB_0015dfdf;
      format = "Too much data supplied for RSA OAEP encryption";
      iVar2 = 0x4dc;
    }
    else {
      if (in_R8D != 3) {
        softHSMLog(3,"encrypt",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                   ,0x4f1,"Invalid padding mechanism supplied (%i)",(ulong)in_R8D);
        return;
      }
      sVar3 = ByteString::size(this_00);
      iVar2 = RSA_size(rsa);
      padding = 1;
      if (sVar3 <= (ulong)(long)(iVar2 + -0xb)) {
LAB_0015dfdf:
        iVar2 = RSA_size(rsa);
        ByteString::resize(in_RCX,(long)iVar2);
        sVar3 = ByteString::size(this_00);
        from = ByteString::const_byte_str(this_00);
        to = ByteString::operator[](in_RCX,0);
        iVar2 = RSA_public_encrypt((int)sVar3,from,to,rsa,padding);
        if (iVar2 != -1) {
          return;
        }
        uVar4 = ERR_get_error();
        softHSMLog(3,"encrypt",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                   ,0x4fb,"RSA public key encryption failed (0x%08X)",uVar4);
        return;
      }
      format = "Too much data supplied for RSA PKCS #1 encryption";
      iVar2 = 0x4cf;
    }
  }
  softHSMLog(3,"encrypt",
             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
             ,iVar2,format);
  return;
}

Assistant:

bool OSSLRSA::encrypt(PublicKey* publicKey, const ByteString& data,
		      ByteString& encryptedData, const AsymMech::Type padding)
{
	// Check if the public key is the right type
	if (!publicKey->isOfType(OSSLRSAPublicKey::type))
	{
		ERROR_MSG("Invalid key type supplied");

		return false;
	}

	// Retrieve the OpenSSL key object
	RSA* rsa = ((OSSLRSAPublicKey*) publicKey)->getOSSLKey();

	// Check the data and padding algorithm
	int osslPadding = 0;

	if (padding == AsymMech::RSA_PKCS)
	{
		// The size of the input data cannot be more than the modulus
		// length of the key - 11
		if (data.size() > (size_t) (RSA_size(rsa) - 11))
		{
			ERROR_MSG("Too much data supplied for RSA PKCS #1 encryption");

			return false;
		}

		osslPadding = RSA_PKCS1_PADDING;
	}
	else if (padding == AsymMech::RSA_PKCS_OAEP)
	{
		// The size of the input data cannot be more than the modulus
		// length of the key - 41
		if (data.size() > (size_t) (RSA_size(rsa) - 41))
		{
			ERROR_MSG("Too much data supplied for RSA OAEP encryption");

			return false;
		}

		osslPadding = RSA_PKCS1_OAEP_PADDING;
	}
	else if (padding == AsymMech::RSA)
	{
		// The size of the input data should be exactly equal to the modulus length
		if (data.size() != (size_t) RSA_size(rsa))
		{
			ERROR_MSG("Incorrect amount of input data supplied for raw RSA encryption");

			return false;
		}

		osslPadding = RSA_NO_PADDING;
	}
	else
	{
		ERROR_MSG("Invalid padding mechanism supplied (%i)", padding);

		return false;
	}

	// Perform the RSA operation
	encryptedData.resize(RSA_size(rsa));

	if (RSA_public_encrypt(data.size(), (unsigned char*) data.const_byte_str(), &encryptedData[0], rsa, osslPadding) == -1)
	{
		ERROR_MSG("RSA public key encryption failed (0x%08X)", ERR_get_error());

		return false;
	}

	return true;
}